

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

void Extra_BitMatrixTransposePP(Vec_Ptr_t *vSimsIn,int nWordsIn,Vec_Wrd_t *vSimsOut,int nWordsOut)

{
  word *pwVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  word *pM [64];
  uint local_258;
  ulong local_250;
  word *local_238 [65];
  
  if (vSimsIn->nSize != nWordsOut * 0x40) {
    __assert_fail("Vec_PtrSize(vSimsIn) == 64 * nWordsOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                  ,0xa6f,"void Extra_BitMatrixTransposePP(Vec_Ptr_t *, int, Vec_Wrd_t *, int)");
  }
  if (vSimsOut->nSize == vSimsIn->nSize * nWordsIn) {
    if (0 < nWordsOut) {
      local_258 = nWordsOut * 0x3f;
      local_250 = 0;
      iVar3 = 0;
      do {
        if (0 < nWordsIn) {
          uVar6 = 0;
          uVar7 = local_258;
          do {
            lVar5 = 0;
            lVar2 = local_250 + 0x3f;
            uVar4 = uVar7;
            do {
              if (((int)uVar4 < 0) || (vSimsOut->nSize <= (int)uVar4)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
              }
              pwVar1 = vSimsOut->pArray;
              local_238[lVar5] = pwVar1 + uVar4;
              if (vSimsIn->nSize <= (int)lVar2) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pwVar1[uVar4] = *(word *)((long)vSimsIn->pArray[lVar2] + uVar6 * 8);
              lVar5 = lVar5 + 1;
              uVar4 = uVar4 - nWordsOut;
              lVar2 = lVar2 + -1;
            } while (lVar5 != 0x40);
            Extra_Transpose64p(local_238);
            uVar6 = uVar6 + 1;
            uVar7 = uVar7 + nWordsOut * 0x40;
          } while (uVar6 != (uint)nWordsIn);
        }
        iVar3 = iVar3 + 1;
        local_258 = local_258 + 1;
        local_250 = (ulong)((int)local_250 + 0x40);
      } while (iVar3 != nWordsOut);
    }
    return;
  }
  __assert_fail("Vec_WrdSize(vSimsOut) == 64 * nWordsOut * nWordsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                ,0xa70,"void Extra_BitMatrixTransposePP(Vec_Ptr_t *, int, Vec_Wrd_t *, int)");
}

Assistant:

void Extra_BitMatrixTransposePP( Vec_Ptr_t * vSimsIn, int nWordsIn, Vec_Wrd_t * vSimsOut, int nWordsOut )
{    
    word * pM[64];  int i, y, x;
    assert( Vec_PtrSize(vSimsIn)  == 64 * nWordsOut );
    assert( Vec_WrdSize(vSimsOut) == 64 * nWordsOut * nWordsIn  );
    for ( x = 0; x < nWordsOut; x++ )
    for ( y = 0; y < nWordsIn;  y++ )
    {
        for ( i = 0; i < 64; i++ )
        {
            pM[i]    = Vec_WrdEntryP( vSimsOut, (64*y+63-i)*nWordsOut + x );
            pM[i][0] = ((word *)Vec_PtrEntry( vSimsIn, 64*x+63-i ))[y];
        }
        Extra_Transpose64p( pM );
    }
}